

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_load_save.cpp
# Opt level: O2

bool Am_Load_Save_Context::Test(Am_Wrapper *in_data)

{
  int iVar1;
  
  if (in_data != (Am_Wrapper *)0x0) {
    iVar1 = (**(in_data->super_Am_Registered_Type)._vptr_Am_Registered_Type)();
    return (Am_ID_Tag)iVar1 == Am_Load_Save_Context_Data::id;
  }
  return false;
}

Assistant:

void
Am_Load_Save_Context::Register_Prototype(const char *name, Am_Wrapper *value)
{
  if (!data) {
    data = new Am_Load_Save_Context_Data();
  }

  data = static_cast<Am_Load_Save_Context_Data *>(data->Make_Unique());

  Wrapper_Holder holder(value);

  data->names->SetAt(holder, Name_Num(name));
  data->prototypes->SetAt(Name_Num(name), holder);
}